

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O0

int unshield_file_directory(Unshield *unshield,int index)

{
  FileDescriptor *pFVar1;
  FileDescriptor *fd;
  int index_local;
  Unshield *unshield_local;
  
  pFVar1 = unshield_get_file_descriptor(unshield,index);
  if (pFVar1 == (FileDescriptor *)0x0) {
    unshield_local._4_4_ = 0xffffffff;
  }
  else {
    unshield_local._4_4_ = pFVar1->directory_index;
  }
  return unshield_local._4_4_;
}

Assistant:

int unshield_file_directory(Unshield* unshield, int index)/*{{{*/
{
  FileDescriptor* fd = unshield_get_file_descriptor(unshield, index);
  if (fd)
  {
    return fd->directory_index;
  }
  else
    return -1;
}